

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

JumpStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::JumpStatementSyntax,slang::syntax::JumpStatementSyntax_const&>
          (BumpAllocator *this,JumpStatementSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  JumpStatementSyntax *pJVar13;
  
  pJVar13 = (JumpStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((JumpStatementSyntax *)this->endPtr < pJVar13 + 1) {
    pJVar13 = (JumpStatementSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pJVar13 + 1);
  }
  (pJVar13->super_StatementSyntax).super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->super_StatementSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_StatementSyntax).super_SyntaxNode.parent;
  (pJVar13->super_StatementSyntax).super_SyntaxNode.kind =
       (args->super_StatementSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pJVar13->super_StatementSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pJVar13->super_StatementSyntax).super_SyntaxNode.parent = pSVar1;
  (pJVar13->super_StatementSyntax).label = (args->super_StatementSyntax).label;
  (pJVar13->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)
           &(args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pJVar13->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pJVar13->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar5;
  (pJVar13->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pJVar13->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006d0438;
  (pJVar13->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_StatementSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pJVar13->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_StatementSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pJVar13->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pJVar13->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006d0388;
  uVar6 = (args->breakOrContinue).field_0x2;
  NVar7.raw = (args->breakOrContinue).numFlags.raw;
  uVar8 = (args->breakOrContinue).rawLen;
  pIVar3 = (args->breakOrContinue).info;
  TVar9 = (args->semi).kind;
  uVar10 = (args->semi).field_0x2;
  NVar11.raw = (args->semi).numFlags.raw;
  uVar12 = (args->semi).rawLen;
  pIVar4 = (args->semi).info;
  (pJVar13->breakOrContinue).kind = (args->breakOrContinue).kind;
  (pJVar13->breakOrContinue).field_0x2 = uVar6;
  (pJVar13->breakOrContinue).numFlags = (NumericTokenFlags)NVar7.raw;
  (pJVar13->breakOrContinue).rawLen = uVar8;
  (pJVar13->breakOrContinue).info = pIVar3;
  (pJVar13->semi).kind = TVar9;
  (pJVar13->semi).field_0x2 = uVar10;
  (pJVar13->semi).numFlags = (NumericTokenFlags)NVar11.raw;
  (pJVar13->semi).rawLen = uVar12;
  (pJVar13->semi).info = pIVar4;
  return pJVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }